

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O2

void __thiscall irr::scene::SSkinMeshBuffer::convertToTangents(SSkinMeshBuffer *this)

{
  pointer pSVar1;
  undefined8 uVar2;
  pointer pSVar3;
  long lVar4;
  u32 n;
  ulong uVar5;
  S3DVertexTangents Vertex;
  
  if (this->VertexType == EVT_STANDARD) {
    lVar4 = 0x1c;
    for (uVar5 = 0;
        pSVar3 = (this->Vertices_Standard).m_data.
                 super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar5 < (((long)(this->Vertices_Standard).m_data.
                        super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x24 &
                0xffffffffU); uVar5 = uVar5 + 1) {
      Vertex.Tangent.Z = 0.0;
      Vertex.Binormal.X = 0.0;
      Vertex.Binormal.Y = 0.0;
      Vertex.Binormal.Z = 0.0;
      Vertex.Tangent.X = 0.0;
      Vertex.Tangent.Y = 0.0;
      Vertex.super_S3DVertex.Color.color = *(u32 *)((long)pSVar3 + lVar4 + -4);
      Vertex.super_S3DVertex.Pos.Z = *(float *)((long)pSVar3 + lVar4 + -0x14);
      Vertex.super_S3DVertex.Pos._0_8_ = *(undefined8 *)((long)pSVar3 + lVar4 + -0x1c);
      uVar2 = *(undefined8 *)((long)pSVar3 + lVar4 + -0x10);
      Vertex.super_S3DVertex.Normal.X = (float)uVar2;
      Vertex.super_S3DVertex.Normal.Y = (float)((ulong)uVar2 >> 0x20);
      Vertex.super_S3DVertex.Normal.Z = *(float *)((long)pSVar3 + lVar4 + -8);
      Vertex.super_S3DVertex.TCoords = *(vector2df *)((long)&(pSVar3->Pos).X + lVar4);
      core::array<irr::video::S3DVertexTangents>::push_back
                ((array<irr::video::S3DVertexTangents> *)&(this->super_IMeshBuffer).field_0x8,
                 &Vertex);
      lVar4 = lVar4 + 0x24;
    }
    core::array<irr::video::S3DVertex>::clear(&this->Vertices_Standard);
  }
  else {
    if (this->VertexType != EVT_2TCOORDS) {
      return;
    }
    lVar4 = 0x1c;
    for (uVar5 = 0;
        pSVar1 = (this->Vertices_2TCoords).m_data.
                 super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (((long)(this->Vertices_2TCoords).m_data.
                        super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x2c &
                0xffffffffU); uVar5 = uVar5 + 1) {
      Vertex.Tangent.Z = 0.0;
      Vertex.Binormal.X = 0.0;
      Vertex.Binormal.Y = 0.0;
      Vertex.Binormal.Z = 0.0;
      Vertex.Tangent.X = 0.0;
      Vertex.Tangent.Y = 0.0;
      Vertex.super_S3DVertex.Color.color = *(u32 *)((long)pSVar1 + lVar4 + -4);
      Vertex.super_S3DVertex.Pos.Z = *(float *)((long)pSVar1 + lVar4 + -0x14);
      Vertex.super_S3DVertex.Pos._0_8_ = *(undefined8 *)((long)pSVar1 + lVar4 + -0x1c);
      uVar2 = *(undefined8 *)((long)pSVar1 + lVar4 + -0x10);
      Vertex.super_S3DVertex.Normal.X = (float)uVar2;
      Vertex.super_S3DVertex.Normal.Y = (float)((ulong)uVar2 >> 0x20);
      Vertex.super_S3DVertex.Normal.Z = *(float *)((long)pSVar1 + lVar4 + -8);
      Vertex.super_S3DVertex.TCoords = *(vector2df *)((long)&(pSVar1->super_S3DVertex).Pos + lVar4);
      core::array<irr::video::S3DVertexTangents>::push_back
                ((array<irr::video::S3DVertexTangents> *)&(this->super_IMeshBuffer).field_0x8,
                 &Vertex);
      lVar4 = lVar4 + 0x2c;
    }
    core::array<irr::video::S3DVertex2TCoords>::clear(&this->Vertices_2TCoords);
  }
  this->VertexType = EVT_TANGENTS;
  return;
}

Assistant:

void convertToTangents()
	{
		if (VertexType == video::EVT_STANDARD) {
			for (u32 n = 0; n < Vertices_Standard.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_Standard[n].Color;
				Vertex.Pos = Vertices_Standard[n].Pos;
				Vertex.Normal = Vertices_Standard[n].Normal;
				Vertex.TCoords = Vertices_Standard[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_Standard.clear();
			VertexType = video::EVT_TANGENTS;
		} else if (VertexType == video::EVT_2TCOORDS) {
			for (u32 n = 0; n < Vertices_2TCoords.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_2TCoords[n].Color;
				Vertex.Pos = Vertices_2TCoords[n].Pos;
				Vertex.Normal = Vertices_2TCoords[n].Normal;
				Vertex.TCoords = Vertices_2TCoords[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_2TCoords.clear();
			VertexType = video::EVT_TANGENTS;
		}
	}